

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::unique_color_projection>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  
  for (lVar1 = (ulong)num << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    unique_color_projection::unique_color_projection
              ((unique_color_projection *)pDst_void,(unique_color_projection *)pSrc_void);
    pSrc_void = (void *)((long)pSrc_void + 0x10);
    pDst_void = (void *)((long)pDst_void + 0x10);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }